

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

longdouble *
S2::GetProjection<long_double>
          (longdouble *__return_storage_ptr__,Vector3<long_double> *x,Vector3<long_double> *a_norm,
          longdouble a_norm_len,Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *error)

{
  D *__return_storage_ptr___00;
  bool bVar1;
  D *b;
  D *b_00;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  __type_conflict _Var2;
  __type_conflict _Var3;
  double dVar4;
  longdouble T_ERR;
  longdouble result;
  longdouble dist;
  longdouble x1_dist2;
  longdouble x0_dist2;
  Vector3<long_double> x1;
  Vector3<long_double> x0;
  longdouble *error_local;
  Vector3<long_double> *a1_local;
  Vector3<long_double> *a0_local;
  longdouble a_norm_len_local;
  Vector3<long_double> *a_norm_local;
  Vector3<long_double> *x_local;
  
  __return_storage_ptr___00 = (D *)((long)x1.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            (__return_storage_ptr___00,
             (BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__,a_norm);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)((long)&x0_dist2 + 8),
             (BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__,a0);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)__return_storage_ptr___00,
             (BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
            ((longdouble *)((long)&x0_dist2 + 8),
             (BasicVector<Vector3,_long_double,_3UL> *)__return_storage_ptr__);
  dVar4 = extraout_XMM0_Qa;
  if (in_ST1 <= in_ST0) {
    if (((in_ST0 != in_ST1) || (NAN(in_ST0) || NAN(in_ST1))) ||
       (bVar1 = util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator<
                          ((BasicVector<Vector3,_long_double,_3UL> *)((long)x1.c_ + 0x28),
                           (D *)((long)&x0_dist2 + 8)), dVar4 = extraout_XMM0_Qa_00, !bVar1)) {
      std::sqrt(dVar4);
      util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
                ((longdouble *)((long)&x0_dist2 + 8),(BasicVector<Vector3,_long_double,_3UL> *)x,
                 b_00);
      unique0x100001af = in_ST2;
      goto LAB_0047bc65;
    }
  }
  std::sqrt(dVar4);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
            ((longdouble *)((long)x1.c_ + 0x28),(BasicVector<Vector3,_long_double,_3UL> *)x,b);
  unique0x100001b9 = in_ST2;
LAB_0047bc65:
  _Var2 = std::sqrt<int>(3);
  _Var3 = std::sqrt<int>(3);
  dVar4 = _Var3 * 32.0 * 1.1102230246251565e-16;
  std::fabs(dVar4);
  *(longdouble *)a1->c_ =
       (longdouble)5.421011e-20 *
       (stack0xffffffffffffff28 *
        ((longdouble)dVar4 + a_norm_len * (longdouble)(_Var2 + _Var2 + 3.5)) +
       (longdouble)1.5 * in_ST4);
  return (longdouble *)a1;
}

Assistant:

static T GetProjection(const Vector3<T>& x,
                       const Vector3<T>& a_norm, T a_norm_len,
                       const Vector3<T>& a0, const Vector3<T>& a1,
                       T* error) {
  // The error in the dot product is proportional to the lengths of the input
  // vectors, so rather than using "x" itself (a unit-length vector) we use
  // the vectors from "x" to the closer of the two edge endpoints.  This
  // typically reduces the error by a huge factor.
  Vector3<T> x0 = x - a0;
  Vector3<T> x1 = x - a1;
  T x0_dist2 = x0.Norm2();
  T x1_dist2 = x1.Norm2();

  // If both distances are the same, we need to be careful to choose one
  // endpoint deterministically so that the result does not change if the
  // order of the endpoints is reversed.
  T dist, result;
  if (x0_dist2 < x1_dist2 || (x0_dist2 == x1_dist2 && x0 < x1)) {
    dist = sqrt(x0_dist2);
    result = x0.DotProd(a_norm);
  } else {
    dist = sqrt(x1_dist2);
    result = x1.DotProd(a_norm);
  }
  // This calculation bounds the error from all sources: the computation of
  // the normal, the subtraction of one endpoint, and the dot product itself.
  // (DBL_ERR appears because the input points are assumed to be normalized in
  // double precision rather than in the given type T.)
  //
  // For reference, the bounds that went into this calculation are:
  // ||N'-N|| <= ((1 + 2 * sqrt(3))||N|| + 32 * sqrt(3) * DBL_ERR) * T_ERR
  // |(A.B)'-(A.B)| <= (1.5 * (A.B) + 1.5 * ||A|| * ||B||) * T_ERR
  // ||(X-Y)'-(X-Y)|| <= ||X-Y|| * T_ERR
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  *error = (((3.5 + 2 * sqrt(3)) * a_norm_len + 32 * sqrt(3) * DBL_ERR)
            * dist + 1.5 * fabs(result)) * T_ERR;
  return result;
}